

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lptree.c
# Opt level: O1

int verifyrule(lua_State *L,TTree *tree,int *passed,int npassed,int nb)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int local_38;
  uint local_34;
  
  uVar5 = (ulong)npassed;
  uVar6 = 1000;
  if (1000 < npassed) {
    uVar6 = (ulong)(uint)npassed;
  }
  local_34 = npassed - 1;
  local_38 = nb;
LAB_0012bce8:
  switch(tree->tag) {
  case '\0':
  case '\x01':
  case '\x02':
  case '\x04':
    return local_38;
  case '\x03':
  case '\x0e':
    return 1;
  case '\x05':
  case '\b':
  case '\t':
    tree = tree + 1;
    local_38 = 1;
    goto LAB_0012bce8;
  case '\x06':
    iVar2 = verifyrule(L,tree + 1,passed,(int)uVar5,0);
    if (iVar2 == 0) {
      return local_38;
    }
    break;
  case '\a':
    local_38 = verifyrule(L,tree + 1,passed,(int)uVar5,local_38);
    break;
  case '\n':
    break;
  default:
    return 0;
  case '\f':
    if (uVar5 == uVar6) {
      uVar6 = uVar5 & 0xffffffff;
      if (1 < (uVar5 & 0xffffffff)) {
        do {
          uVar5 = (ulong)local_34;
          do {
            uVar4 = (int)uVar5 - 1;
            uVar5 = (ulong)uVar4;
            if (passed[uVar6 - 1] == passed[uVar5]) {
              lua_rawgeti(L,-1,(long)passed[uVar6 - 1]);
              pcVar3 = val2str(L,-1);
              iVar2 = luaL_error(L,"rule \'%s\' may be left recursive",pcVar3);
              return iVar2;
            }
          } while (0 < (int)uVar4);
          local_34 = local_34 - 1;
          bVar1 = 2 < (long)uVar6;
          uVar6 = uVar6 - 1;
        } while (bVar1);
      }
      iVar2 = luaL_error(L,"too many left calls in grammar");
      return iVar2;
    }
    passed[uVar5] = (uint)tree->key;
    uVar5 = uVar5 + 1;
    tree = tree + 1;
    local_34 = local_34 + 1;
    goto LAB_0012bce8;
  case '\r':
    iVar2 = checkaux(tree,0);
    return iVar2;
  case '\x0f':
  case '\x10':
    goto switchD_0012bcfe_caseD_f;
  }
  tree = tree + (tree->u).ps;
  goto LAB_0012bce8;
switchD_0012bcfe_caseD_f:
  tree = tree + 1;
  goto LAB_0012bce8;
}

Assistant:

static int verifyrule (lua_State *L, TTree *tree, int *passed, int npassed,
                       int nb) {
 tailcall:
  switch (tree->tag) {
    case TChar: case TSet: case TAny:
    case TFalse:
      return nb;  /* cannot pass from here */
    case TTrue:
    case TBehind:  /* look-behind cannot have calls */
      return 1;
    case TNot: case TAnd: case TRep:
      /* return verifyrule(L, sib1(tree), passed, npassed, 1); */
      tree = sib1(tree); nb = 1; goto tailcall;
    case TCapture: case TRunTime:
      /* return verifyrule(L, sib1(tree), passed, npassed, nb); */
      tree = sib1(tree); goto tailcall;
    case TCall:
      /* return verifyrule(L, sib2(tree), passed, npassed, nb); */
      tree = sib2(tree); goto tailcall;
    case TSeq:  /* only check 2nd child if first is nb */
      if (!verifyrule(L, sib1(tree), passed, npassed, 0))
        return nb;
      /* else return verifyrule(L, sib2(tree), passed, npassed, nb); */
      tree = sib2(tree); goto tailcall;
    case TChoice:  /* must check both children */
      nb = verifyrule(L, sib1(tree), passed, npassed, nb);
      /* return verifyrule(L, sib2(tree), passed, npassed, nb); */
      tree = sib2(tree); goto tailcall;
    case TRule:
      if (npassed >= MAXRULES)
        return verifyerror(L, passed, npassed);
      else {
        passed[npassed++] = tree->key;
        /* return verifyrule(L, sib1(tree), passed, npassed); */
        tree = sib1(tree); goto tailcall;
      }
    case TGrammar:
      return nullable(tree);  /* sub-grammar cannot be left recursive */
    default: assert(0); return 0;
  }
}